

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void vec_gen_3_mipsel(TCGContext_conflict4 *tcg_ctx,TCGOpcode opc,TCGType_conflict type,uint vece,
                     TCGArg r,TCGArg a,TCGArg b)

{
  TCGOp *pTVar1;
  
  pTVar1 = tcg_emit_op_mipsel(tcg_ctx,opc);
  pTVar1->field_0x1 = (byte)((vece << 0xc) >> 8) | (byte)(type * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar1->args[0] = r;
  pTVar1->args[1] = a;
  pTVar1->args[2] = b;
  return;
}

Assistant:

void vec_gen_3(TCGContext *tcg_ctx, TCGOpcode opc, TCGType type, unsigned vece,
               TCGArg r, TCGArg a, TCGArg b)
{
    TCGOp *op = tcg_emit_op(tcg_ctx, opc);
    TCGOP_VECL(op) = type - TCG_TYPE_V64;
    TCGOP_VECE(op) = vece;
    op->args[0] = r;
    op->args[1] = a;
    op->args[2] = b;
}